

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::CreateUtilityOutput
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *targetName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_2,cmListFileBacktrace *param_3)

{
  string *a;
  cmSourceFile *this_00;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38 [32];
  
  a = GetCurrentBinaryDirectory_abi_cxx11_(this);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[13],std::__cxx11::string_const&>
            (__return_storage_ptr__,a,(char (*) [13])0x6a244f,targetName);
  this_00 = cmMakefile::GetOrCreateGeneratedSource(this->Makefile,__return_storage_ptr__);
  if (this_00 == (cmSourceFile *)0x0) {
    std::operator+(&local_58,"Could not get source file entry for ",__return_storage_ptr__);
    cmSystemTools::Error(&local_58);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"SYMBOLIC",&local_59);
    std::__cxx11::string::string<std::allocator<char>>(local_38,"1",&local_5a);
    cmSourceFile::SetProperty(this_00,&local_58,(string *)local_38);
    std::__cxx11::string::~string(local_38);
  }
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::CreateUtilityOutput(
  std::string const& targetName, std::vector<std::string> const&,
  cmListFileBacktrace const&)
{
  std::string force =
    cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles/", targetName);
  // The output is not actually created so mark it symbolic.
  if (cmSourceFile* sf = this->Makefile->GetOrCreateGeneratedSource(force)) {
    sf->SetProperty("SYMBOLIC", "1");
  } else {
    cmSystemTools::Error("Could not get source file entry for " + force);
  }
  return force;
}